

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

sub_string parse_token(sub_string *text)

{
  char cVar1;
  bool bVar2;
  char *begin;
  char *pcVar3;
  http_parsing_error *this;
  char c;
  char *start;
  sub_string *text_local;
  
  begin = sub_string::begin(text);
  while (bVar2 = sub_string::empty(text), !bVar2) {
    pcVar3 = sub_string::operator[](text,0);
    cVar1 = *pcVar3;
    if (((((((cVar1 < '!') || (cVar1 == '(')) || (cVar1 == ')')) ||
          ((cVar1 == '<' || (cVar1 == '>')))) ||
         ((cVar1 == '@' || ((cVar1 == ',' || (cVar1 == ';')))))) || (cVar1 == ':')) ||
       (((((cVar1 == '\\' || (cVar1 == '\"')) || (cVar1 == '/')) ||
         (((cVar1 == '[' || (cVar1 == ']')) ||
          ((cVar1 == '?' || ((cVar1 == '=' || (cVar1 == '{')))))))) ||
        ((cVar1 == '}' || (cVar1 == '\x7f')))))) break;
    sub_string::advance(text,1);
  }
  pcVar3 = sub_string::begin(text);
  if (begin != pcVar3) {
    pcVar3 = sub_string::begin(text);
    sub_string::sub_string((sub_string *)&text_local,begin,pcVar3);
    return _text_local;
  }
  this = (http_parsing_error *)__cxa_allocate_exception(0x10);
  http_parsing_error::http_parsing_error(this,"invalid token");
  __cxa_throw(this,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
}

Assistant:

sub_string parse_token(sub_string& text)
{
    // token          = 1*<any CHAR except CTLs or separators>
    // separators     = "(" | ")" | "<" | ">" | "@"
    //                | "," | ";" | ":" | "\" | <">
    //                | "/" | "[" | "]" | "?" | "="
    //                | "{" | "}" | SP | HT
    // CTL            = <any US-ASCII control character
    //                  (octets 0 - 31) and DEL (127)>
    // HT             = <US-ASCII HT, horizontal-tab (9)>

    char const* start = text.begin();

    for (;;)
    {
        if (text.empty())
            break;
        char c = text[0];
        if (c <= ' '
         || c == '(' || c == ')' || c == '<' || c == '>' || c == '@'
         || c == ',' || c == ';' || c == ':' || c == '\\' || c == '"'
         || c == '/' || c == '[' || c == ']' || c == '?' || c == '='
         || c == '{' || c == '}' || c == '\x7f')
            break;

        text.advance(1);
    }

    if (start == text.begin())
        throw http_parsing_error("invalid token");

    return sub_string{start, text.begin()};
}